

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O1

QStringList *
QLibraryInfo::platformPluginArguments(QStringList *__return_storage_ptr__,QString *platformName)

{
  QSettings *this;
  long in_FS_OFFSET;
  QAnyStringView key;
  unique_ptr<QSettings,_std::default_delete<QSettings>_> settings;
  QString local_78;
  QSettings *local_58;
  undefined1 local_50 [24];
  qsizetype local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QSettings *)&DAT_aaaaaaaaaaaaaaaa;
  findConfiguration();
  this = local_58;
  if (local_58 != (QSettings *)0x0) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_50._0_8_ = (PrivateShared *)0xa;
    local_50._8_8_ = "Platforms/";
    local_38 = 9;
    local_30 = "Arguments";
    local_50._16_8_ = platformName;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>(&local_78,
                       (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
                        *)local_50);
    key.m_size = local_78.d.size | 0x8000000000000000;
    key.field_0.m_data = local_78.d.ptr;
    QSettings::value((QVariant *)local_50,this,key);
    ::QVariant::toStringList(__return_storage_ptr__,(QVariant *)local_50);
    ::QVariant::~QVariant((QVariant *)local_50);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_58 != (QSettings *)0x0) {
    (*(local_58->super_QObject)._vptr_QObject[4])();
  }
  if (this == (QSettings *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QLibraryInfo::platformPluginArguments(const QString &platformName)
{
#if QT_CONFIG(settings)
    if (const auto settings = findConfiguration()) {
        const QString key = "Platforms/"_L1
                + platformName
                + "Arguments"_L1;
        return settings->value(key).toStringList();
    }
#else
    Q_UNUSED(platformName);
#endif // settings
    return QStringList();
}